

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgParticleSwarm.cpp
# Opt level: O0

void __thiscall
TasOptimization::ParticleSwarmState::initializeParticlesInsideBox
          (ParticleSwarmState *this,double *box_lower,double *box_upper,
          function<double_()> *get_random01)

{
  reference pvVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double range;
  int i;
  function<double_()> *get_random01_local;
  double *box_upper_local;
  double *box_lower_local;
  ParticleSwarmState *this_local;
  
  for (range._4_4_ = 0; range._4_4_ < this->num_particles * this->num_dimensions;
      range._4_4_ = range._4_4_ + 1) {
    dVar2 = ABS(box_upper[range._4_4_ % this->num_dimensions] -
                box_lower[range._4_4_ % this->num_dimensions]);
    dVar3 = std::function<double_()>::operator()(get_random01);
    dVar4 = box_lower[range._4_4_ % this->num_dimensions];
    pvVar1 = std::vector<double,_std::allocator<double>_>::operator[]
                       (&this->particle_positions,(long)range._4_4_);
    *pvVar1 = dVar2 * dVar3 + dVar4;
    dVar4 = std::function<double_()>::operator()(get_random01);
    pvVar1 = std::vector<double,_std::allocator<double>_>::operator[]
                       (&this->particle_velocities,(long)range._4_4_);
    *pvVar1 = dVar2 * 2.0 * dVar4 + -dVar2;
  }
  this->positions_initialized = true;
  this->velocities_initialized = true;
  return;
}

Assistant:

void ParticleSwarmState::initializeParticlesInsideBox(const double box_lower[], const double box_upper[],
                                                      const std::function<double(void)> get_random01) {
    for (int i=0; i<num_particles * num_dimensions; i++) {
        double range = std::fabs(box_upper[i % num_dimensions] - box_lower[i % num_dimensions]);
        particle_positions[i] = range * get_random01() + box_lower[i % num_dimensions];
        particle_velocities[i] = 2 * range * get_random01() - range;
    }
    positions_initialized = true;
    velocities_initialized = true;
}